

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_2::BlendEquationSeparateTestCase::SetBlendEquation
          (BlendEquationSeparateTestCase *this,GLenum equation)

{
  GLenum GVar1;
  GLenum equation_local;
  BlendEquationSeparateTestCase *this_local;
  
  GVar1 = (this->super_BlendEquationTestCase).m_testTargetName;
  if (GVar1 == 0x8009) {
    glu::CallLogWrapper::glBlendEquationSeparate
              (&(this->super_BlendEquationTestCase).super_ApiCase.super_CallLogWrapper,equation,
               0x8006);
  }
  else if (GVar1 == 0x883d) {
    glu::CallLogWrapper::glBlendEquationSeparate
              (&(this->super_BlendEquationTestCase).super_ApiCase.super_CallLogWrapper,0x8006,
               equation);
  }
  return;
}

Assistant:

void SetBlendEquation (GLenum equation)
	{
		switch (m_testTargetName)
		{
		case GL_BLEND_EQUATION_RGB:
			glBlendEquationSeparate(equation, GL_FUNC_ADD);
			break;

		case GL_BLEND_EQUATION_ALPHA:
			glBlendEquationSeparate(GL_FUNC_ADD, equation);
			break;

		default:
			DE_ASSERT(false && "should not happen");
			break;
		}
	}